

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_cpio_bin_xz.c
# Opt level: O0

void test_read_format_cpio_bin_xz(void)

{
  int iVar1;
  archive *paVar2;
  void *in_stack_00000010;
  int r;
  archive *a;
  archive_entry *ae;
  archive *in_stack_ffffffffffffffd8;
  archive *paVar3;
  archive *in_stack_ffffffffffffffe0;
  wchar_t in_stack_ffffffffffffffe8;
  wchar_t in_stack_ffffffffffffffec;
  wchar_t wVar4;
  archive_entry *in_stack_fffffffffffffff8;
  
  paVar2 = archive_read_new();
  assertion_assert((char *)paVar2,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                   (char *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  archive_read_support_filter_all(in_stack_ffffffffffffffd8);
  paVar3 = paVar2;
  assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar2 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)in_stack_ffffffffffffffe0,(longlong)paVar2,(char *)0x1727c0,
                      in_stack_00000010);
  iVar1 = archive_read_support_filter_xz
                    ((archive *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  if (iVar1 == -0x14) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_bin_xz.c"
                   ,L'9');
    wVar4 = (wchar_t)((ulong)paVar3 >> 0x20);
    test_skipping("xz reading not fully supported on this platform");
    archive_read_free((archive *)0x1727fe);
    assertion_equal_int((char *)in_stack_fffffffffffffff8,wVar4,
                        CONCAT44(iVar1,in_stack_ffffffffffffffe8),(char *)in_stack_ffffffffffffffe0,
                        0,(char *)0x17282c,in_stack_00000010);
  }
  else {
    archive_read_support_format_all(paVar2);
    paVar2 = paVar3;
    assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar3 >> 0x20),
                        CONCAT44(iVar1,in_stack_ffffffffffffffe8),(char *)in_stack_ffffffffffffffe0,
                        (longlong)paVar3,(char *)0x17286a,in_stack_00000010);
    archive_read_open_memory(in_stack_ffffffffffffffe0,paVar3,0x172880);
    paVar3 = paVar2;
    assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar2 >> 0x20),
                        CONCAT44(iVar1,in_stack_ffffffffffffffe8),(char *)in_stack_ffffffffffffffe0,
                        (longlong)paVar2,(char *)0x1728af,in_stack_00000010);
    archive_read_next_header(in_stack_ffffffffffffffe0,(archive_entry **)paVar2);
    paVar2 = paVar3;
    assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar3 >> 0x20),
                        CONCAT44(iVar1,in_stack_ffffffffffffffe8),(char *)in_stack_ffffffffffffffe0,
                        (longlong)paVar3,(char *)0x1728ed,in_stack_00000010);
    archive_filter_code(in_stack_ffffffffffffffe0,(int)((ulong)paVar3 >> 0x20));
    assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar2 >> 0x20),
                        CONCAT44(iVar1,in_stack_ffffffffffffffe8),(char *)in_stack_ffffffffffffffe0,
                        0,(char *)0x17292b,in_stack_00000010);
    archive_format(paVar2);
    assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar2 >> 0x20),
                        CONCAT44(iVar1,in_stack_ffffffffffffffe8),(char *)in_stack_ffffffffffffffe0,
                        0,(char *)0x172967,in_stack_00000010);
    archive_entry_is_encrypted(in_stack_fffffffffffffff8);
    assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar2 >> 0x20),
                        CONCAT44(iVar1,in_stack_ffffffffffffffe8),(char *)in_stack_ffffffffffffffe0,
                        0,(char *)0x1729a0,in_stack_00000010);
    archive_read_has_encrypted_entries((archive *)CONCAT44(iVar1,in_stack_ffffffffffffffe8));
    assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar2 >> 0x20),
                        CONCAT44(iVar1,in_stack_ffffffffffffffe8),(char *)in_stack_ffffffffffffffe0,
                        (longlong)paVar2,(char *)0x1729dc,in_stack_00000010);
    archive_read_close((archive *)0x1729e6);
    assertion_equal_int((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar2 >> 0x20),
                        CONCAT44(iVar1,in_stack_ffffffffffffffe8),(char *)in_stack_ffffffffffffffe0,
                        (longlong)paVar2,(char *)0x172a15,in_stack_00000010);
    wVar4 = (wchar_t)((ulong)paVar2 >> 0x20);
    archive_read_free((archive *)0x172a1f);
    assertion_equal_int((char *)in_stack_fffffffffffffff8,wVar4,
                        CONCAT44(iVar1,in_stack_ffffffffffffffe8),(char *)in_stack_ffffffffffffffe0,
                        0,(char *)0x172a4d,in_stack_00000010);
  }
  return;
}

Assistant:

DEFINE_TEST(test_read_format_cpio_bin_xz)
{
	struct archive_entry *ae;
	struct archive *a;
	int r;

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	r = archive_read_support_filter_xz(a);
	if (r == ARCHIVE_WARN) {
		skipping("xz reading not fully supported on this platform");
		assertEqualInt(ARCHIVE_OK, archive_read_free(a));
		return;
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_memory(a, archive, sizeof(archive)));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(archive_filter_code(a, 0), ARCHIVE_FILTER_XZ);
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_CPIO_BIN_LE);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}